

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetCursorPosYAndSetupForPrevLine(float pos_y,float line_height)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiOldColumns *pIVar3;
  ImGuiTable *pIVar4;
  ImGuiContext *pIVar5;
  float in_XMM0_Da;
  float fVar6;
  float in_XMM1_Da;
  int row_increase;
  ImGuiTable *table;
  ImGuiOldColumns *columns;
  float off_y;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *in_stack_000000b0;
  
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  fVar1 = (pIVar2->DC).CursorPos.y;
  (pIVar2->DC).CursorPos.y = in_XMM0_Da;
  fVar6 = ImMax<float>((pIVar2->DC).CursorMaxPos.y,in_XMM0_Da);
  (pIVar2->DC).CursorMaxPos.y = fVar6;
  (pIVar2->DC).CursorPosPrevLine.y = (pIVar2->DC).CursorPos.y - in_XMM1_Da;
  (pIVar2->DC).PrevLineSize.y = in_XMM1_Da - (pIVar5->Style).ItemSpacing.y;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  if (pIVar3 != (ImGuiOldColumns *)0x0) {
    pIVar3->LineMinY = (pIVar2->DC).CursorPos.y;
  }
  pIVar4 = pIVar5->CurrentTable;
  if (pIVar4 != (ImGuiTable *)0x0) {
    if ((pIVar4->IsInsideRow & 1U) != 0) {
      ImGui::TableEndRow(in_stack_000000b0);
    }
    pIVar4->RowPosY2 = (pIVar2->DC).CursorPos.y;
    pIVar4->RowBgColorCounter =
         (int)((in_XMM0_Da - fVar1) / in_XMM1_Da + 0.5) + pIVar4->RowBgColorCounter;
  }
  return;
}

Assistant:

static void SetCursorPosYAndSetupForPrevLine(float pos_y, float line_height)
{
    // Set cursor position and a few other things so that SetScrollHereY() and Columns() can work when seeking cursor.
    // FIXME: It is problematic that we have to do that here, because custom/equivalent end-user code would stumble on the same issue.
    // The clipper should probably have a 4th step to display the last item in a regular manner.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float off_y = pos_y - window->DC.CursorPos.y;
    window->DC.CursorPos.y = pos_y;
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, pos_y);
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y - line_height;  // Setting those fields so that SetScrollHereY() can properly function after the end of our clipper usage.
    window->DC.PrevLineSize.y = (line_height - g.Style.ItemSpacing.y);      // If we end up needing more accurate data (to e.g. use SameLine) we may as well make the clipper have a fourth step to let user process and display the last item in their list.
    if (ImGuiOldColumns* columns = window->DC.CurrentColumns)
        columns->LineMinY = window->DC.CursorPos.y;                         // Setting this so that cell Y position are set properly
    if (ImGuiTable* table = g.CurrentTable)
    {
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);
        table->RowPosY2 = window->DC.CursorPos.y;
        const int row_increase = (int)((off_y / line_height) + 0.5f);
        //table->CurrentRow += row_increase; // Can't do without fixing TableEndRow()
        table->RowBgColorCounter += row_increase;
    }
}